

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O1

int test_empty_monster(flatcc_builder_t *B)

{
  flatcc_builder_ref_t fVar1;
  int iVar2;
  int iVar3;
  flatcc_builder_ref_t *pfVar4;
  void *addr;
  char *pcVar5;
  size_t size;
  size_t local_20;
  
  flatcc_builder_reset(B);
  flatcc_builder_start_buffer(B,"MONS",0,0);
  flatcc_builder_start_table(B,0x24);
  fVar1 = flatcc_builder_create_string_str(B,"MyMonster");
  if (fVar1 != 0) {
    pfVar4 = flatcc_builder_table_add_offset(B,3);
    if (pfVar4 != (flatcc_builder_ref_t *)0x0) {
      *pfVar4 = fVar1;
    }
  }
  iVar2 = flatcc_builder_check_required(B,__MyGame_Example_Monster_required,1);
  if (iVar2 == 0) {
    __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_Monster_required, sizeof(__MyGame_Example_Monster_required) / sizeof(__MyGame_Example_Monster_required[0]) - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_builder.h"
                  ,0x149,
                  "MyGame_Example_Monster_ref_t MyGame_Example_Monster_end(flatbuffers_builder_t *)"
                 );
  }
  fVar1 = flatcc_builder_end_table(B);
  flatcc_builder_end_buffer(B,fVar1);
  addr = flatcc_builder_finalize_aligned_buffer(B,&local_20);
  hexdump("empty monster table",addr,local_20,_stderr);
  iVar2 = verify_empty_monster(addr);
  if (iVar2 == 0) {
    iVar2 = flatcc_verify_table_as_root(addr,local_20,"MONS",MyGame_Example_Monster_verify_table);
    if (iVar2 == 0) {
      iVar3 = flatcc_verify_table_as_root
                        (addr,local_20 - 1,"MONS",MyGame_Example_Monster_verify_table);
      iVar2 = 0;
      if (iVar3 != 0) goto LAB_00104ca0;
      puts("Monster verify failed to detect short buffer");
    }
    else {
      pcVar5 = flatcc_verify_error_string(iVar2);
      printf("could not verify empty monster, got %s\n",pcVar5);
    }
    iVar2 = -1;
  }
  else {
LAB_00104ca0:
    flatcc_builder_aligned_free(addr);
  }
  return iVar2;
}

Assistant:

int test_empty_monster(flatcc_builder_t *B)
{
    int ret;
    ns(Monster_ref_t) root;
    void *buffer;
    size_t size;

    flatcc_builder_reset(B);

    flatbuffers_buffer_start(B, ns(Monster_file_identifier));
    ns(Monster_start(B));
    /* Cannot make monster empty as name is required. */
    ns(Monster_name_create_str(B, "MyMonster"));
    root = ns(Monster_end(B));
    flatbuffers_buffer_end(B, root);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);

    hexdump("empty monster table", buffer, size, stderr);
    if ((ret = verify_empty_monster(buffer))) {
        goto done;
    }

    if ((ret = ns(Monster_verify_as_root_with_identifier(buffer, size, ns(Monster_file_identifier))))) {
        printf("could not verify empty monster, got %s\n", flatcc_verify_error_string(ret));
        return -1;
    }

    /*
     * Note: this will assert if the verifier is set to assert during
     * debugging. Also not that a buffer size - 1 is not necessarily
     * invalid, but because we pack vtables tight at the end, we expect
     * failure in this case.
     */
    if (flatcc_verify_ok == ns(Monster_verify_as_root(
                    buffer, size - 1))) {
        printf("Monster verify failed to detect short buffer\n");
        return -1;
    }

done:
    flatcc_builder_aligned_free(buffer);
    return ret;
}